

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O0

fdb_status fdb_set(fdb_kvs_handle *handle,fdb_doc *doc)

{
  ushort uVar1;
  fdb_txn *pfVar2;
  void *__src;
  size_t __n;
  list *list;
  btreeblk_handle *handle_00;
  long lVar3;
  docio_length len;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  file_status_t fVar7;
  wal_dirty_t wVar8;
  fdb_status fVar9;
  undefined4 uVar10;
  uint32_t __useconds;
  fdb_seqnum_t fVar11;
  bid_t bVar12;
  size_t sVar13;
  list_elem *e;
  list_elem *plVar14;
  uint64_t uVar15;
  fdb_seqnum_t *pfVar16;
  bool bVar17;
  char *local_1a0;
  undefined1 auStack_198 [6];
  uint8_t in_stack_fffffffffffffe6e;
  uint8_t in_stack_fffffffffffffe6f;
  docio_object *in_stack_fffffffffffffe70;
  ulong local_188;
  void *local_180;
  size_t local_178;
  undefined8 local_170;
  filemgr_dirty_update_node *new_node;
  filemgr_dirty_update_node *prev_node;
  wal_flush_items flush_items;
  bid_t dirty_seqtree_root;
  bid_t dirty_idtree_root;
  fdb_doc kv_ins_doc;
  fdb_kvs_handle *root_handle;
  bottom_up_build_entry *bub_entry;
  fdb_seqnum_t kv_seqnum_1;
  fdb_seqnum_t kv_seqnum;
  size_t throttling_delay;
  int size_chunk;
  fdb_status wr;
  _fdb_key_cmp_info cmp_info;
  fdb_txn *txn;
  undefined1 auStack_80 [3];
  file_status_t fstatus;
  bool immediate_remove;
  bool wal_flushed;
  bool sub_handle;
  bool txn_enabled;
  timeval tv;
  docio_handle *dhandle;
  filemgr *file;
  docio_object _doc;
  uint64_t offset;
  fdb_doc *doc_local;
  fdb_kvs_handle *handle_local;
  
  if (handle == (fdb_kvs_handle *)0x0) {
    return FDB_RESULT_INVALID_HANDLE;
  }
  local_1a0 = (char *)0x13d3bf;
  docio_object::docio_object(in_stack_fffffffffffffe70);
  bVar17 = false;
  bVar5 = false;
  bVar4 = false;
  pfVar2 = handle->fhandle->root->txn;
  if (((handle->config).flags & 2) != 0) {
    local_1a0 = handle->file->filename;
    fVar9 = fdb_log_impl(&handle->log_callback,3,FDB_RESULT_RONLY_VIOLATION,
                         "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/forestdb.cc"
                         ,"fdb_set",0x1025,
                         "Warning: SET is not allowed on the read-only DB file \'%s\'.");
    return fVar9;
  }
  if ((((((doc == (fdb_doc *)0x0) || (doc->key == (void *)0x0)) || (doc->keylen == 0)) ||
       (0xff80 < doc->keylen)) ||
      (((doc->metalen != 0 && (doc->meta == (void *)0x0)) ||
       ((doc->bodylen != 0 && (doc->body == (void *)0x0)))))) ||
     (((handle->kvs_config).custom_cmp != (fdb_custom_cmp_variable)0x0 &&
      ((ulong)((handle->config).blocksize - 0x100) < doc->keylen)))) {
    return FDB_RESULT_INVALID_ARGS;
  }
  local_1a0 = (char *)0x13d4fd;
  bVar6 = atomic_cas_uint8_t((atomic<unsigned_char> *)in_stack_fffffffffffffe70,
                             in_stack_fffffffffffffe6f,in_stack_fffffffffffffe6e);
  if (!bVar6) {
    return FDB_RESULT_HANDLE_BUSY;
  }
  file._0_2_ = (ushort)doc->keylen;
  sVar13 = doc->metalen;
  if ((doc->deleted & 1U) == 0) {
    local_178 = doc->bodylen;
  }
  else {
    local_178 = 0;
  }
  uVar10 = (undefined4)local_178;
  _doc._16_8_ = doc->key;
  if ((doc->deleted & 1U) == 0) {
    local_180 = doc->body;
  }
  else {
    local_180 = (void *)0x0;
  }
  pfVar16 = (fdb_seqnum_t *)auStack_198;
  if (handle->kvs != (kvs_info *)0x0) {
    uVar1 = (handle->config).chunksize;
    file._0_2_ = (short)(int)doc->keylen + uVar1;
    lVar3 = -(ulong)((ushort)file + 0xf & 0xfffffff0);
    _doc._16_8_ = auStack_198 + lVar3;
    *(undefined8 *)(auStack_198 + lVar3 + -8) = 0x13d5fd;
    kvid2buf(*(size_t *)((long)&local_180 + lVar3),*(fdb_kvs_id_t *)((long)&local_188 + lVar3),
             *(void **)(&stack0xfffffffffffffe70 + lVar3));
    __src = doc->key;
    __n = doc->keylen;
    *(undefined8 *)(auStack_198 + lVar3 + -8) = 1299999;
    memcpy((undefined1 *)(_doc._16_8_ + (long)(int)(uint)uVar1),__src,__n);
    bVar17 = handle->kvs->type == '\x01';
    pfVar16 = (fdb_seqnum_t *)_doc._16_8_;
  }
  while( true ) {
    pfVar16[-1] = 0x13d64a;
    fdb_check_file_reopen(handle,(file_status_t *)0x0);
    pfVar16[-1] = 0x13d657;
    __useconds = filemgr_get_throttling_delay((filemgr *)pfVar16[-1]);
    if (__useconds != 0) {
      pfVar16[-1] = 0x13d678;
      usleep(__useconds);
    }
    pfVar16[-1] = 0x13d6b8;
    filemgr_mutex_lock((filemgr *)pfVar16[-1]);
    pfVar16[-1] = 0x13d6c1;
    fdb_sync_db_header((fdb_kvs_handle *)pfVar16[0x16]);
    pfVar16[-1] = 0x13d6ce;
    bVar6 = filemgr_is_rollback_on((filemgr *)pfVar16[1]);
    if (bVar6) {
      pfVar16[-1] = 0x13d6e1;
      filemgr_mutex_unlock((filemgr *)pfVar16[-1]);
      pfVar16[-1] = 0x13d6f8;
      atomic_cas_uint8_t((atomic<unsigned_char> *)pfVar16[1],*(uint8_t *)((long)pfVar16 + 7),
                         *(uint8_t *)((long)pfVar16 + 6));
      return FDB_RESULT_FAIL_BY_ROLLBACK;
    }
    tv.tv_usec = (__suseconds_t)handle->dhandle;
    pfVar16[-1] = 0x13d725;
    fVar7 = filemgr_get_file_status((filemgr *)pfVar16[-1]);
    if (fVar7 != '\x04') break;
    pfVar16[-1] = 0x13d73a;
    filemgr_mutex_unlock((filemgr *)pfVar16[-1]);
  }
  if (bVar17) {
    pfVar16[-1] = 0x13d75e;
    fVar11 = fdb_kvs_get_seqnum((filemgr *)*pfVar16,pfVar16[-1]);
    if ((doc->seqnum == 0xffffffffffffffff) || ((doc->flags & 1) == 0)) {
      doc->seqnum = fVar11 + 1;
      handle->seqnum = doc->seqnum;
      pfVar16[-1] = 0x13d81f;
      fdb_kvs_set_seqnum((filemgr *)pfVar16[0x1f],pfVar16[0x1e],pfVar16[0x1d]);
    }
    else {
      if (fVar11 < doc->seqnum) {
        handle->seqnum = doc->seqnum;
        pfVar16[-1] = 0x13d7c3;
        fdb_kvs_set_seqnum((filemgr *)pfVar16[0x1f],pfVar16[0x1e],pfVar16[0x1d]);
      }
      doc->flags = doc->flags & 0xfffffffe;
    }
  }
  else {
    pfVar16[-1] = 0x13d82d;
    fVar11 = filemgr_get_seqnum((filemgr *)pfVar16[-1]);
    if ((doc->seqnum == 0xffffffffffffffff) || ((doc->flags & 1) == 0)) {
      doc->seqnum = fVar11 + 1;
      handle->seqnum = doc->seqnum;
      pfVar16[-1] = 0x13d8d6;
      filemgr_set_seqnum((filemgr *)pfVar16[1],*pfVar16);
    }
    else {
      if (fVar11 < doc->seqnum) {
        handle->seqnum = doc->seqnum;
        pfVar16[-1] = 0x13d886;
        filemgr_set_seqnum((filemgr *)pfVar16[1],*pfVar16);
      }
      doc->flags = doc->flags & 0xfffffffe;
    }
  }
  if ((doc->deleted & 1U) != 0) {
    pfVar16[-1] = 0x13d8fb;
    gettimeofday((timeval *)auStack_80,(__timezone_ptr_t)0x0);
  }
  pfVar16[-1] = 0x13d93b;
  bVar12 = docio_append_doc((docio_handle *)pfVar16[1],(docio_object *)*pfVar16,
                            *(uint8_t *)((long)pfVar16 + -1),*(uint8_t *)((long)pfVar16 + -2));
  if (bVar12 == 0xffffffffffffffff) {
    pfVar16[-1] = 0x13d94f;
    filemgr_mutex_unlock((filemgr *)pfVar16[-1]);
    pfVar16[-1] = 0x13d966;
    atomic_cas_uint8_t((atomic<unsigned_char> *)pfVar16[1],*(uint8_t *)((long)pfVar16 + 7),
                       *(uint8_t *)((long)pfVar16 + 6));
    return FDB_RESULT_WRITE_FAIL;
  }
  if (((doc->deleted & 1U) != 0) && ((handle->config).purging_interval == 0)) {
    bVar4 = true;
  }
  len.metalen = (short)sVar13;
  len.keylen = (ushort)file;
  len.bodylen = uVar10;
  len._8_8_ = _doc.length._0_8_;
  pfVar16[-1] = 0x13d9b6;
  sVar13 = _fdb_get_docsize(len);
  doc->size_ondisk = sVar13;
  doc->offset = bVar12;
  if (((handle->config).bottom_up_index_build & 1U) == 0) {
    if (handle->kvs == (kvs_info *)0x0) {
      if (bVar4) {
        pfVar16[-1] = 0x13dbb1;
        wal_immediate_remove
                  ((fdb_txn *)pfVar16[5],(filemgr *)pfVar16[4],(_fdb_key_cmp_info *)pfVar16[3],
                   (fdb_doc *)pfVar16[2],pfVar16[1],*(wal_insert_by *)((long)pfVar16 + 4));
      }
      else {
        pfVar16[-1] = 0x13db8d;
        wal_insert((fdb_txn *)pfVar16[5],(filemgr *)pfVar16[4],(_fdb_key_cmp_info *)pfVar16[3],
                   (fdb_doc *)pfVar16[2],pfVar16[1],*(wal_insert_by *)((long)pfVar16 + 4));
      }
    }
    else {
      pfVar16[-1] = 0x13dafb;
      memcpy(&dirty_idtree_root,doc,0x50);
      kv_ins_doc.size_ondisk = _doc._16_8_;
      dirty_idtree_root = (ulong)(ushort)file;
      if (bVar4) {
        pfVar16[-1] = 0x13db63;
        wal_immediate_remove
                  ((fdb_txn *)pfVar16[5],(filemgr *)pfVar16[4],(_fdb_key_cmp_info *)pfVar16[3],
                   (fdb_doc *)pfVar16[2],pfVar16[1],*(wal_insert_by *)((long)pfVar16 + 4));
      }
      else {
        pfVar16[-1] = 0x13db3c;
        wal_insert((fdb_txn *)pfVar16[5],(filemgr *)pfVar16[4],(_fdb_key_cmp_info *)pfVar16[3],
                   (fdb_doc *)pfVar16[2],pfVar16[1],*(wal_insert_by *)((long)pfVar16 + 4));
      }
    }
    pfVar16[-1] = 0x13dbbc;
    wVar8 = wal_get_dirty_status((filemgr *)pfVar16[1]);
    if (wVar8 == '\0') {
      pfVar16[-1] = 0x13dbd4;
      wal_set_dirty_status
                ((filemgr *)pfVar16[1],*(wal_dirty_t *)((long)pfVar16 + 7),
                 *(bool *)((long)pfVar16 + 6));
    }
  }
  else {
    pfVar16[-1] = 0x13da03;
    e = (list_elem *)malloc(0x30);
    e[1].next = (list_elem *)(ulong)(ushort)file;
    pfVar16[-1] = 0x13da26;
    plVar14 = (list_elem *)malloc((ulong)(ushort)file);
    e[1].prev = plVar14;
    plVar14 = e[1].prev;
    pfVar16[-1] = 0x13da4e;
    memcpy(plVar14,(void *)_doc._16_8_,(ulong)(ushort)file);
    e[2].next = (list_elem *)doc->seqnum;
    e[2].prev = (list_elem *)doc->offset;
    kv_ins_doc._72_8_ = handle->fhandle->root;
    list = (((fdb_kvs_handle *)kv_ins_doc._72_8_)->bub_ctx).entries;
    pfVar16[-1] = 0x13daa0;
    list_push_back(list,e);
    *(long *)(kv_ins_doc._72_8_ + 0x1f0) = *(long *)(kv_ins_doc._72_8_ + 0x1f0) + 1;
    *(size_t *)(kv_ins_doc._72_8_ + 0x1f8) = doc->size_ondisk + *(long *)(kv_ins_doc._72_8_ + 0x1f8)
    ;
  }
  if (((handle->config).auto_commit & 1U) != 0) {
    pfVar16[-1] = 0x13dbec;
    local_188 = wal_get_num_flushable((filemgr *)pfVar16[-1]);
    pfVar16[-1] = 0x13dbfc;
    uVar15 = _fdb_get_wal_threshold(handle);
    if (uVar15 < local_188) {
      bVar5 = true;
      goto LAB_0013de24;
    }
  }
  if (((handle->config).wal_flush_before_commit & 1U) != 0) {
    dirty_seqtree_root = 0xffffffffffffffff;
    flush_items.tree.aux = (void *)0xffffffffffffffff;
    if (pfVar2 == (fdb_txn *)0x0) {
      handle->dirty_updates = '\x01';
    }
    pfVar16[-1] = 0x13dc55;
    sVar13 = wal_get_num_flushable((filemgr *)pfVar16[-1]);
    pfVar16[-1] = 0x13dc65;
    uVar15 = _fdb_get_wal_threshold(handle);
    if (uVar15 < sVar13) {
      pfVar16[-1] = 0x13dc9b;
      fVar9 = wal_commit((fdb_txn *)pfVar16[0x17],(filemgr *)pfVar16[0x16],
                         (wal_commit_mark_func *)pfVar16[0x15],(err_log_callback *)pfVar16[0x14]);
      if (fVar9 != FDB_RESULT_SUCCESS) {
        pfVar16[-1] = 0x13dcb3;
        filemgr_mutex_unlock((filemgr *)pfVar16[-1]);
        pfVar16[-1] = 0x13dcca;
        atomic_cas_uint8_t((atomic<unsigned_char> *)pfVar16[1],*(uint8_t *)((long)pfVar16 + 7),
                           *(uint8_t *)((long)pfVar16 + 6));
        return fVar9;
      }
      new_node = (filemgr_dirty_update_node *)0x0;
      local_170 = 0;
      pfVar16[-1] = 0x13dd19;
      _fdb_dirty_update_ready
                ((fdb_kvs_handle *)pfVar16[5],(filemgr_dirty_update_node **)pfVar16[4],
                 (filemgr_dirty_update_node **)pfVar16[3],(bid_t *)pfVar16[2],(bid_t *)pfVar16[1],
                 *(bool *)((long)pfVar16 + 7));
      pfVar16[-2] = (fdb_seqnum_t)&prev_node;
      pfVar16[-3] = 0x13dd51;
      fVar9 = wal_flush((filemgr *)pfVar16[5],(void *)pfVar16[4],(wal_flush_func *)pfVar16[3],
                        (wal_get_old_offset_func *)pfVar16[2],(wal_flush_seq_purge_func *)pfVar16[1]
                        ,(wal_flush_kvs_delta_stats_func *)*pfVar16,(wal_flush_items *)pfVar16[7]);
      if (fVar9 != FDB_RESULT_SUCCESS) {
        handle_00 = handle->bhandle;
        pfVar16[-1] = 0x13dd71;
        btreeblk_clear_dirty_update(handle_00);
        pfVar16[-1] = 0x13dd85;
        filemgr_dirty_update_close_node((filemgr *)pfVar16[1],(filemgr_dirty_update_node *)*pfVar16)
        ;
        pfVar16[-1] = 0x13dd99;
        filemgr_dirty_update_remove_node
                  ((filemgr *)pfVar16[1],(filemgr_dirty_update_node *)*pfVar16);
        pfVar16[-1] = 0x13dda2;
        filemgr_mutex_unlock((filemgr *)pfVar16[-1]);
        pfVar16[-1] = 0x13ddb9;
        atomic_cas_uint8_t((atomic<unsigned_char> *)pfVar16[1],*(uint8_t *)((long)pfVar16 + 7),
                           *(uint8_t *)((long)pfVar16 + 6));
        return fVar9;
      }
      pfVar16[-1] = 0x13ddef;
      _fdb_dirty_update_finalize
                ((fdb_kvs_handle *)pfVar16[5],(filemgr_dirty_update_node *)pfVar16[4],
                 (filemgr_dirty_update_node *)pfVar16[3],(bid_t *)pfVar16[2],(bid_t *)pfVar16[1],
                 *(bool *)((long)pfVar16 + 7));
      pfVar16[-1] = 0x13ddff;
      wal_set_dirty_status
                ((filemgr *)pfVar16[1],*(wal_dirty_t *)((long)pfVar16 + 7),
                 *(bool *)((long)pfVar16 + 6));
      pfVar16[-1] = 0x13de0f;
      wal_release_flushed_items((filemgr *)pfVar16[7],(wal_flush_items *)pfVar16[6]);
      bVar5 = true;
      pfVar16[-1] = 0x13de20;
      btreeblk_reset_subblock_info((btreeblk_handle *)pfVar16[1]);
    }
  }
LAB_0013de24:
  pfVar16[-1] = 0x13de2d;
  filemgr_mutex_unlock((filemgr *)pfVar16[-1]);
  if ((doc->deleted & 1U) == 0) {
    pfVar16[-1] = 0x13de46;
    atomic_incr_uint64_t((atomic<unsigned_long> *)pfVar16[1],*(memory_order *)((long)pfVar16 + 4));
  }
  if ((bVar5) && (((handle->config).auto_commit & 1U) != 0)) {
    pfVar16[-1] = 0x13de70;
    atomic_cas_uint8_t((atomic<unsigned_char> *)pfVar16[1],*(uint8_t *)((long)pfVar16 + 7),
                       *(uint8_t *)((long)pfVar16 + 6));
    pfVar16[-1] = 0x13de84;
    handle_local._4_4_ =
         _fdb_commit((fdb_kvs_handle *)pfVar16[0x1a],*(fdb_commit_opt_t *)((long)pfVar16 + 0xcf),
                     *(bool *)((long)pfVar16 + 0xce));
  }
  else {
    pfVar16[-1] = 0x13dea0;
    atomic_cas_uint8_t((atomic<unsigned_char> *)pfVar16[1],*(uint8_t *)((long)pfVar16 + 7),
                       *(uint8_t *)((long)pfVar16 + 6));
    handle_local._4_4_ = FDB_RESULT_SUCCESS;
  }
  return handle_local._4_4_;
}

Assistant:

LIBFDB_API
fdb_status fdb_set(fdb_kvs_handle *handle, fdb_doc *doc)
{
    if (!handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    uint64_t offset;
    struct docio_object _doc;
    struct filemgr *file;
    struct docio_handle *dhandle;
    struct timeval tv;
    bool txn_enabled = false;
    bool sub_handle = false;
    bool wal_flushed = false;
    bool immediate_remove = false;
    file_status_t fstatus;
    fdb_txn *txn = handle->fhandle->root->txn;
    struct _fdb_key_cmp_info cmp_info;
    fdb_status wr = FDB_RESULT_SUCCESS;
    LATENCY_STAT_START();

    if (handle->config.flags & FDB_OPEN_FLAG_RDONLY) {
        return fdb_log(&handle->log_callback, FDB_LOG_WARNING,
                       FDB_RESULT_RONLY_VIOLATION,
                       "Warning: SET is not allowed on the read-only DB file '%s'.",
                       handle->file->filename);
    }

    if (!doc || doc->key == NULL ||
        doc->keylen == 0 || doc->keylen > FDB_MAX_KEYLEN ||
        (doc->metalen > 0 && doc->meta == NULL) ||
        (doc->bodylen > 0 && doc->body == NULL) ||
        (handle->kvs_config.custom_cmp &&
            doc->keylen > handle->config.blocksize - HBTRIE_HEADROOM)) {
        return FDB_RESULT_INVALID_ARGS;
    }

    if (!atomic_cas_uint8_t(&handle->handle_busy, 0, 1)) {
        return FDB_RESULT_HANDLE_BUSY;
    }

    _doc.length.keylen = doc->keylen;
    _doc.length.metalen = doc->metalen;
    _doc.length.bodylen = doc->deleted ? 0 : doc->bodylen;
    _doc.key = doc->key;
    _doc.meta = doc->meta;
    _doc.body = doc->deleted ? NULL : doc->body;

    if (handle->kvs) {
        // multi KV instance mode
        // allocate more (temporary) space for key, to store ID number
        int size_chunk = handle->config.chunksize;
        _doc.length.keylen = doc->keylen + size_chunk;
        _doc.key = alca(uint8_t, _doc.length.keylen);
        // copy ID
        kvid2buf(size_chunk, handle->kvs->id, _doc.key);
        // copy key
        memcpy((uint8_t*)_doc.key + size_chunk, doc->key, doc->keylen);

        if (handle->kvs->type == KVS_SUB) {
            sub_handle = true;
        } else {
            sub_handle = false;
        }
    }

fdb_set_start:
    fdb_check_file_reopen(handle, NULL);

    size_t throttling_delay = filemgr_get_throttling_delay(handle->file);
    if (throttling_delay) {
        usleep(throttling_delay);
    }

    cmp_info.kvs_config = handle->kvs_config;
    cmp_info.kvs = handle->kvs;

    filemgr_mutex_lock(handle->file);
    fdb_sync_db_header(handle);

    if (filemgr_is_rollback_on(handle->file)) {
        filemgr_mutex_unlock(handle->file);
        atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
        return FDB_RESULT_FAIL_BY_ROLLBACK;
    }

    file = handle->file;
    dhandle = handle->dhandle;

    fstatus = filemgr_get_file_status(file);
    if (fstatus == FILE_REMOVED_PENDING) {
        // we must not write into this file
        // file status was changed by other thread .. start over
        filemgr_mutex_unlock(file);
        goto fdb_set_start;
    }

    if (sub_handle) {
        // multiple KV instance mode AND sub handle
        fdb_seqnum_t kv_seqnum = fdb_kvs_get_seqnum(file,
                                                    handle->kvs->id);
        if (doc->seqnum != SEQNUM_NOT_USED &&
            doc->flags & FDB_CUSTOM_SEQNUM) { // User specified own seqnum
            if (kv_seqnum < doc->seqnum) { // track highest seqnum in handle,kv
                handle->seqnum = doc->seqnum;
                fdb_kvs_set_seqnum(file, handle->kvs->id,
                                   handle->seqnum);
            }
            doc->flags &= ~FDB_CUSTOM_SEQNUM; // clear flag for fdb_doc reuse
        } else { // normal monotonically increasing sequence numbers..
            doc->seqnum = ++kv_seqnum;
            handle->seqnum = doc->seqnum; // keep handle's seqnum the highest
            fdb_kvs_set_seqnum(file, handle->kvs->id, handle->seqnum);
        }
    } else {
        fdb_seqnum_t kv_seqnum = filemgr_get_seqnum(file);
        // super handle OR single KV instance mode
        if (doc->seqnum != SEQNUM_NOT_USED &&
            doc->flags & FDB_CUSTOM_SEQNUM) { // User specified own seqnum
            if (kv_seqnum < doc->seqnum) { // track highest seqnum in handle,kv
                handle->seqnum = doc->seqnum;
                filemgr_set_seqnum(file, handle->seqnum);
            }
            doc->flags &= ~FDB_CUSTOM_SEQNUM; // clear flag for fdb_doc reuse
        } else { // normal monotonically increasing sequence numbers..
            doc->seqnum = ++kv_seqnum;
            handle->seqnum = doc->seqnum;
            filemgr_set_seqnum(file, handle->seqnum);
        }
    }
    _doc.seqnum = doc->seqnum;

    if (doc->deleted) {
        // set timestamp
        gettimeofday(&tv, NULL);
        _doc.timestamp = (timestamp_t)tv.tv_sec;
    } else {
        _doc.timestamp = 0;
    }

    if (txn) {
        txn_enabled = true;
    }

    offset = docio_append_doc(dhandle, &_doc, doc->deleted, txn_enabled);
    if (offset == BLK_NOT_FOUND) {
        filemgr_mutex_unlock(file);
        atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
        return FDB_RESULT_WRITE_FAIL;
    }

    if (doc->deleted && !handle->config.purging_interval) {
        // immediately remove from hbtrie upon WAL flush
        immediate_remove = true;
    }

    doc->size_ondisk = _fdb_get_docsize(_doc.length);
    doc->offset = offset;
    if (!txn) {
        txn = &file->global_txn;
    }

    if (handle->config.bottom_up_index_build) {
        // Bottom-up build mode, bypass WAL.
        struct bottom_up_build_entry* bub_entry =
            (struct bottom_up_build_entry*)
            malloc(sizeof(struct bottom_up_build_entry));
        bub_entry->keylen = _doc.length.keylen;
        bub_entry->key = (void*)malloc(_doc.length.keylen);
        memcpy(bub_entry->key, _doc.key, _doc.length.keylen);
        bub_entry->seqnum = doc->seqnum;
        bub_entry->offset = doc->offset;

        fdb_kvs_handle* root_handle = handle->fhandle->root;
        list_push_back(root_handle->bub_ctx.entries, &bub_entry->le);
        root_handle->bub_ctx.num_entries++;
        root_handle->bub_ctx.space_used += doc->size_ondisk;

    } else {
        if (handle->kvs) {
            // multi KV instance mode
            fdb_doc kv_ins_doc = *doc;
            kv_ins_doc.key = _doc.key;
            kv_ins_doc.keylen = _doc.length.keylen;
            if (!immediate_remove) {
                wal_insert(txn, file, &cmp_info, &kv_ins_doc, offset,
                           WAL_INS_WRITER);
            } else {
                wal_immediate_remove(txn, file, &cmp_info, &kv_ins_doc, offset,
                                     WAL_INS_WRITER);
            }
        } else {
            if (!immediate_remove) {
                wal_insert(txn, file, &cmp_info, doc, offset, WAL_INS_WRITER);
            } else {
                wal_immediate_remove(txn, file, &cmp_info, doc, offset,
                                     WAL_INS_WRITER);
            }
        }

        if (wal_get_dirty_status(file)== FDB_WAL_CLEAN) {
            wal_set_dirty_status(file, FDB_WAL_DIRTY);
        }
    }

    if (handle->config.auto_commit &&
        wal_get_num_flushable(file) > _fdb_get_wal_threshold(handle)) {
        // we don't need dirty WAL flushing in auto commit mode
        // (_fdb_commit() is internally called at the end of this function)
        wal_flushed = true;

    } else if (handle->config.wal_flush_before_commit) {

        bid_t dirty_idtree_root = BLK_NOT_FOUND;
        bid_t dirty_seqtree_root = BLK_NOT_FOUND;

        if (!txn_enabled) {
            handle->dirty_updates = 1;
        }

        if (wal_get_num_flushable(file) > _fdb_get_wal_threshold(handle)) {
            union wal_flush_items flush_items;

            // commit only for non-transactional WAL entries
            wr = wal_commit(&file->global_txn, file, NULL, &handle->log_callback);
            if (wr != FDB_RESULT_SUCCESS) {
                filemgr_mutex_unlock(file);
                atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
                return wr;
            }

            struct filemgr_dirty_update_node *prev_node = NULL, *new_node = NULL;

            _fdb_dirty_update_ready(handle, &prev_node, &new_node,
                                    &dirty_idtree_root, &dirty_seqtree_root, true);

            wr = wal_flush(file, (void *)handle,
                           _fdb_wal_flush_func, _fdb_wal_get_old_offset,
                           _fdb_wal_flush_seq_purge, _fdb_wal_flush_kvs_delta_stats,
                           &flush_items);

            if (wr != FDB_RESULT_SUCCESS) {
                btreeblk_clear_dirty_update(handle->bhandle);
                filemgr_dirty_update_close_node(handle->file, prev_node);
                filemgr_dirty_update_remove_node(handle->file, new_node);
                filemgr_mutex_unlock(file);
                atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
                return wr;
            }

            _fdb_dirty_update_finalize(handle, prev_node, new_node,
                                       &dirty_idtree_root, &dirty_seqtree_root, false);

            wal_set_dirty_status(file, FDB_WAL_PENDING);
            // it is ok to release flushed items becuase
            // these items are not actually committed yet.
            // they become visible after fdb_commit is invoked.
            wal_release_flushed_items(file, &flush_items);

            wal_flushed = true;
            btreeblk_reset_subblock_info(handle->bhandle);
        }
    }

    filemgr_mutex_unlock(file);

    LATENCY_STAT_END(file, FDB_LATENCY_SETS);

    if (!doc->deleted) {
        atomic_incr_uint64_t(&handle->op_stats->num_sets, std::memory_order_relaxed);
    }

    if (wal_flushed && handle->config.auto_commit) {
        atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
        return _fdb_commit(handle->fhandle->root, FDB_COMMIT_NORMAL,
                           false); // asynchronous commit only
    }
    atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
    return FDB_RESULT_SUCCESS;
}